

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcf_state_ast(int n,mpc_val_t **xs)

{
  undefined8 *__ptr;
  mpc_val_t *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  __ptr = (undefined8 *)*xs;
  pmVar1 = xs[1];
  if (pmVar1 != (mpc_val_t *)0x0) {
    uVar2 = *__ptr;
    uVar3 = __ptr[1];
    uVar4 = __ptr[3];
    *(undefined8 *)((long)pmVar1 + 0x20) = __ptr[2];
    *(undefined8 *)((long)pmVar1 + 0x28) = uVar4;
    *(undefined8 *)((long)pmVar1 + 0x10) = uVar2;
    *(undefined8 *)((long)pmVar1 + 0x18) = uVar3;
  }
  free(__ptr);
  return pmVar1;
}

Assistant:

mpc_val_t *mpcf_state_ast(int n, mpc_val_t **xs) {
  mpc_state_t *s = ((mpc_state_t**)xs)[0];
  mpc_ast_t *a = ((mpc_ast_t**)xs)[1];
  (void)n;
  a = mpc_ast_state(a, *s);
  free(s);
  return a;
}